

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

stbtt__buf stbtt__cff_index_get(stbtt__buf b,int i)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uchar *puVar7;
  uchar *puVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  stbtt__buf sVar14;
  stbtt__buf sVar15;
  
  puVar7 = b.data;
  uVar3 = b._8_8_ >> 0x20;
  uVar2 = b.size;
  uVar5 = (int)uVar2 >> 0x1f & uVar2;
  uVar1 = 0;
  iVar9 = 2;
  do {
    if ((int)uVar5 < (int)uVar2) {
      lVar12 = (long)(int)uVar5;
      uVar5 = uVar5 + 1;
      uVar10 = (uint)puVar7[lVar12];
    }
    else {
      uVar10 = 0;
    }
    uVar1 = uVar1 << 8 | uVar10;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  uVar10 = 0;
  if ((int)uVar5 < (int)uVar2) {
    lVar12 = (long)(int)uVar5;
    uVar5 = uVar5 + 1;
    uVar11 = (uint)puVar7[lVar12];
  }
  else {
    uVar11 = 0;
  }
  uVar5 = i * uVar11 + uVar5;
  uVar6 = (ulong)uVar5;
  if ((int)uVar2 < (int)uVar5) {
    uVar6 = uVar3;
  }
  if ((int)uVar5 < 0) {
    uVar6 = uVar3;
  }
  if (uVar11 != 0) {
    uVar10 = 0;
    uVar5 = uVar11;
    do {
      iVar9 = (int)uVar6;
      if (iVar9 < (int)uVar2) {
        uVar6 = (ulong)(iVar9 + 1);
        uVar4 = (uint)puVar7[iVar9];
      }
      else {
        uVar4 = 0;
      }
      uVar10 = uVar10 << 8 | uVar4;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  uVar5 = 0;
  for (uVar4 = uVar11; uVar4 != 0; uVar4 = uVar4 - 1) {
    iVar9 = (int)uVar6;
    if (iVar9 < (int)uVar2) {
      uVar6 = (ulong)(iVar9 + 1);
      uVar13 = (uint)puVar7[iVar9];
    }
    else {
      uVar13 = 0;
    }
    uVar5 = uVar5 << 8 | uVar13;
  }
  uVar1 = uVar11 * (uVar1 + 1) + uVar10 + 2;
  uVar5 = uVar5 - uVar10;
  if (-1 < (int)(uVar5 | uVar1)) {
    puVar8 = (uchar *)0x0;
    if ((int)uVar1 <= (int)uVar2) {
      lVar12 = 0;
      if ((int)uVar5 <= (int)(uVar2 - uVar1)) {
        puVar8 = puVar7 + uVar1;
        lVar12 = (ulong)uVar5 << 0x20;
      }
      sVar14.cursor = (int)lVar12;
      sVar14.size = (int)((ulong)lVar12 >> 0x20);
      sVar14.data = puVar8;
      return sVar14;
    }
  }
  sVar15.size = 0;
  sVar15.data = (uchar *)0x0;
  sVar15.cursor = 0;
  return sVar15;
}

Assistant:

static stbtt__buf stbtt__cff_index_get(stbtt__buf b, int i)
{
   int count, offsize, start, end;
   stbtt__buf_seek(&b, 0);
   count = stbtt__buf_get16(&b);
   offsize = stbtt__buf_get8(&b);
   STBTT_assert(i >= 0 && i < count);
   STBTT_assert(offsize >= 1 && offsize <= 4);
   stbtt__buf_skip(&b, i*offsize);
   start = stbtt__buf_get(&b, offsize);
   end = stbtt__buf_get(&b, offsize);
   return stbtt__buf_range(&b, 2+(count+1)*offsize+start, end - start);
}